

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall fasttext::Dictionary::getId(Dictionary *this,string_view w)

{
  string_view w_00;
  int32_t iVar1;
  const_reference pvVar2;
  size_t in_RDX;
  Dictionary *in_RSI;
  long in_RDI;
  char *unaff_retaddr;
  int32_t h;
  
  w_00._M_str = unaff_retaddr;
  w_00._M_len = in_RDX;
  iVar1 = find(in_RSI,w_00);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar1);
  return *pvVar2;
}

Assistant:

int32_t Dictionary::getId(const std::string_view w) const {
  int32_t h = find(w);
  return word2int_[h];
}